

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

int SUNDlsMat_denseORMQR
              (realtype **a,sunindextype m,sunindextype n,realtype *beta,realtype *vn,realtype *vm,
              realtype *v)

{
  double dVar1;
  realtype *prVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  realtype *prVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  realtype rVar12;
  
  uVar10 = (ulong)(uint)n;
  if (0 < n) {
    uVar4 = 0;
    do {
      vm[uVar4] = vn[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar10 != uVar4);
  }
  if (n < m) {
    memset(vm + n,0,(ulong)(uint)(~n + m) * 8 + 8);
  }
  if (0 < n) {
    uVar11 = m - n;
    lVar5 = uVar10 * 8;
    prVar6 = vm + uVar10;
    do {
      uVar11 = uVar11 + 1;
      uVar4 = uVar10 - 1;
      prVar2 = a[uVar10 - 1];
      *v = 1.0;
      rVar12 = vm[uVar10 - 1];
      lVar7 = (long)m - uVar4;
      if (1 < lVar7) {
        lVar9 = 1;
        do {
          dVar1 = *(double *)((long)prVar2 + lVar9 * 8 + lVar5 + -8);
          v[lVar9] = dVar1;
          rVar12 = rVar12 + dVar1 * prVar6[lVar9 + -1];
          lVar9 = lVar9 + 1;
        } while (lVar9 < lVar7);
      }
      if (0 < lVar7) {
        dVar1 = beta[uVar4];
        uVar8 = 0;
        do {
          prVar6[uVar8 - 1] = v[uVar8] * -rVar12 * dVar1 + prVar6[uVar8 - 1];
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
      }
      lVar5 = lVar5 + -8;
      prVar6 = prVar6 + -1;
      bVar3 = 1 < (long)uVar10;
      uVar10 = uVar4;
    } while (bVar3);
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseORMQR(realtype **a, sunindextype m, sunindextype n, realtype *beta,
                         realtype *vn, realtype *vm, realtype *v)
{
  realtype *col_j, s;
  sunindextype i, j;

  /* Initialize vm */
  for(i=0; i<n; i++) vm[i] = vn[i];
  for(i=n; i<m; i++) vm[i] = ZERO;

  /* Accumulate (backwards) corrections into vm */
  for(j=n-1; j>=0; j--) {

    col_j = a[j];

    v[0] = ONE;
    s = vm[j];
    for(i=1; i<m-j; i++) {
      v[i] = col_j[i+j];
      s += v[i]*vm[i+j];
    }
    s *= beta[j];

    for(i=0; i<m-j; i++) vm[i+j] -= s * v[i];

  }

  return(0);
}